

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ec_asn1.cc
# Opt level: O0

int i2o_ECPublicKey(EC_KEY *key,uchar **out)

{
  int iVar1;
  int local_58;
  undefined1 local_50 [4];
  int ret;
  CBB cbb;
  uint8_t **outp_local;
  EC_KEY *key_local;
  
  cbb.u._24_8_ = out;
  if (key == (EC_KEY *)0x0) {
    ERR_put_error(0xf,0,0x43,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/ec/ec_asn1.cc"
                  ,0x210);
    key_local._4_4_ = 0;
  }
  else {
    iVar1 = CBB_init((CBB *)local_50,0);
    if ((iVar1 == 0) ||
       (iVar1 = EC_POINT_point2cbb((CBB *)local_50,*(EC_GROUP **)key,*(EC_POINT **)(key + 8),
                                   *(point_conversion_form_t *)(key + 0x1c),(BN_CTX *)0x0),
       iVar1 == 0)) {
      CBB_cleanup((CBB *)local_50);
      key_local._4_4_ = -1;
    }
    else {
      local_58 = CBB_finish_i2d((CBB *)local_50,(uint8_t **)cbb.u._24_8_);
      if (local_58 < 1) {
        local_58 = 0;
      }
      key_local._4_4_ = local_58;
    }
  }
  return key_local._4_4_;
}

Assistant:

int i2o_ECPublicKey(const EC_KEY *key, uint8_t **outp) {
  if (key == NULL) {
    OPENSSL_PUT_ERROR(EC, ERR_R_PASSED_NULL_PARAMETER);
    return 0;
  }
  CBB cbb;
  if (!CBB_init(&cbb, 0) ||  //
      !EC_POINT_point2cbb(&cbb, key->group, key->pub_key, key->conv_form,
                          NULL)) {
    CBB_cleanup(&cbb);
    return -1;
  }
  int ret = CBB_finish_i2d(&cbb, outp);
  // Historically, this function used the wrong return value on error.
  return ret > 0 ? ret : 0;
}